

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::RunContext(RunContext *this,IConfigPtr *_config,IStreamingReporterPtr *reporter)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  IStreamingReporter *pIVar2;
  bool bVar3;
  int iVar4;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_001a9ad0;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__RunContext_001a9b90;
  (*(((_config->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_NonCopyable)._vptr_NonCopyable[4])(&local_50);
  (this->m_runInfo).name._M_dataplus._M_p = (pointer)&(this->m_runInfo).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_runInfo,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (IMutableContext::currentContext == (IMutableContext *)0x0) {
    IMutableContext::currentContext = (IMutableContext *)operator_new(0x30);
    (IMutableContext::currentContext->super_IContext)._vptr_IContext =
         (_func_int **)&PTR__Context_001a9570;
    IMutableContext::currentContext[1].super_IContext._vptr_IContext =
         (_func_int **)&PTR__Context_001a95c0;
    IMutableContext::currentContext[2].super_IContext._vptr_IContext = (_func_int **)0x0;
    IMutableContext::currentContext[3].super_IContext._vptr_IContext = (_func_int **)0x0;
    IMutableContext::currentContext[4].super_IContext._vptr_IContext = (_func_int **)0x0;
    IMutableContext::currentContext[5].super_IContext._vptr_IContext = (_func_int **)0x0;
  }
  this->m_context = IMutableContext::currentContext;
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  (this->m_lastResult).nullableValue = (AssertionResult *)0x0;
  (this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_config->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (_config->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->m_totals).error = 0;
  (this->m_totals).assertions.passed = 0;
  (this->m_totals).assertions.failed = 0;
  (this->m_totals).assertions.failedButOk = 0;
  (this->m_totals).testCases.passed = 0;
  (this->m_totals).testCases.failed = 0;
  (this->m_totals).testCases.failedButOk = 0;
  (this->m_reporter)._M_t.
  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>.
  _M_t.
  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
       (reporter->_M_t).
       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
       ._M_t.
       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (reporter->_M_t).
  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>.
  _M_t.
  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
       (IStreamingReporter *)0x0;
  (this->m_messageScopes).
  super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messageScopes).
  super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_messageScopes).
  super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lastAssertionInfo).macroName.m_start = "";
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_lastAssertionInfo).lineInfo.file = "";
  (this->m_lastAssertionInfo).lineInfo.line = 0;
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_trackerContext).m_rootTracker.
  super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_trackerContext).m_rootTracker.
  super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->m_trackerContext).m_rootTracker.
           super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = 0;
  *(undefined8 *)((long)&(this->m_trackerContext).m_currentTracker + 4) = 0;
  FatalConditionHandler::FatalConditionHandler(&this->m_fatalConditionhandler);
  this->m_lastAssertionPassed = false;
  this->m_shouldReportUnexpected = true;
  iVar4 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[5])();
  bVar3 = true;
  if ((char)iVar4 == '\0') {
    iVar4 = (*((this->m_reporter)._M_t.
               super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
               ._M_t.
               super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
               .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
              _vptr_IStreamingReporter[2])();
    bVar3 = (bool)((byte)((uint)iVar4 >> 8) & 1);
  }
  this->m_includeSuccessfulResults = bVar3;
  (*(this->m_context->super_IContext)._vptr_IContext[6])(this->m_context,&this->super_IRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,&this->m_config);
  (*(this->m_context->super_IContext)._vptr_IContext[5])(this->m_context,this);
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IStreamingReporter[5])(pIVar2,&this->m_runInfo);
  return;
}

Assistant:

RunContext::RunContext(IConfigPtr const& _config, IStreamingReporterPtr&& reporter)
    :   m_runInfo(_config->name()),
        m_context(getCurrentMutableContext()),
        m_config(_config),
        m_reporter(std::move(reporter)),
        m_lastAssertionInfo{ StringRef(), SourceLineInfo("",0), StringRef(), ResultDisposition::Normal },
        m_includeSuccessfulResults( m_config->includeSuccessfulResults() || m_reporter->getPreferences().shouldReportAllAssertions )
    {
        m_context.setRunner(this);
        m_context.setConfig(m_config);
        m_context.setResultCapture(this);
        m_reporter->testRunStarting(m_runInfo);
    }